

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::PrimitiveTypeHelper<13>::Serialize
               (void *ptr,CodedOutputStream *output)

{
  io::CodedOutputStream::WriteVarint32(output,*ptr);
  return;
}

Assistant:

static void Serialize(const void* ptr, io::CodedOutputStream* output) {
    WireFormatLite::WriteUInt32NoTag(Get<uint32>(ptr), output);
  }